

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O3

int AF_A_OverlayFlags(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  uint uVar2;
  int iVar3;
  undefined8 *puVar4;
  PClass *pPVar5;
  PClass *pPVar6;
  DPSprite *pDVar7;
  undefined4 in_register_00000014;
  ulong uVar8;
  VMValue *pVVar9;
  char *pcVar10;
  undefined8 *puVar11;
  bool bVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  
  pPVar5 = AActor::RegistrationInfo.MyClass;
  uVar8 = CONCAT44(in_register_00000014,numparam);
  if (numparam < 1) {
    pcVar10 = "(paramnum) < numparam";
    goto LAB_0055a0f9;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    puVar11 = (undefined8 *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (puVar11 == (undefined8 *)0x0) {
LAB_00559f3e:
        puVar11 = (undefined8 *)0x0;
        pVVar9 = param;
      }
      else {
        auVar14._8_8_ = uVar8;
        auVar14._0_8_ = puVar11[1];
        if (puVar11[1] == 0) {
          auVar14 = (**(code **)*puVar11)(puVar11);
          puVar11[1] = auVar14._0_8_;
        }
        pPVar6 = auVar14._0_8_;
        bVar12 = pPVar6 == (PClass *)0x0;
        ret = (VMReturn *)(ulong)!bVar12;
        uVar8 = (ulong)bVar12;
        bVar13 = pPVar6 == pPVar5;
        if (!bVar13 && !bVar12) {
          do {
            pPVar6 = pPVar6->ParentClass;
            ret = (VMReturn *)(ulong)(pPVar6 != (PClass *)0x0);
            if (pPVar6 == pPVar5) break;
          } while (pPVar6 != (PClass *)0x0);
        }
        pVVar9 = (VMValue *)(ulong)(bVar13 || bVar12);
        if ((char)ret == '\0') {
          pcVar10 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0055a0f9;
        }
      }
      pPVar5 = AActor::RegistrationInfo.MyClass;
      if (numparam != 1) {
        VVar1 = param[1].field_0.field_3.Type;
        if (VVar1 != 0xff) {
          if (VVar1 != '\x03') goto LAB_0055a071;
          puVar4 = (undefined8 *)param[1].field_0.field_1.a;
          if (param[1].field_0.field_1.atag == 1) {
            if (puVar4 != (undefined8 *)0x0) {
              pPVar6 = (PClass *)puVar4[1];
              if (pPVar6 == (PClass *)0x0) {
                pPVar6 = (PClass *)(**(code **)*puVar4)(puVar4,pVVar9,uVar8,ret);
                puVar4[1] = pPVar6;
              }
              bVar12 = pPVar6 != (PClass *)0x0;
              if (pPVar6 != pPVar5 && bVar12) {
                do {
                  pPVar6 = pPVar6->ParentClass;
                  bVar12 = pPVar6 != (PClass *)0x0;
                  if (pPVar6 == pPVar5) break;
                } while (pPVar6 != (PClass *)0x0);
              }
              if (!bVar12) {
                pcVar10 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
                goto LAB_0055a0f9;
              }
            }
          }
          else if (puVar4 != (undefined8 *)0x0) goto LAB_0055a071;
        }
        if (2 < numparam) {
          VVar1 = param[2].field_0.field_3.Type;
          if ((VVar1 != 0xff) &&
             ((VVar1 != '\x03' ||
              ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0))))
             )) {
            pcVar10 = 
            "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
            ;
            goto LAB_0055a0f9;
          }
          if (numparam != 3) {
            if (param[3].field_0.field_3.Type == '\0') {
              if (numparam == 4) {
                pcVar10 = "(paramnum) < numparam";
              }
              else {
                if (param[4].field_0.field_3.Type == '\0') {
                  if ((uint)numparam < 6) {
                    pcVar10 = "(paramnum) < numparam";
                  }
                  else {
                    if (param[5].field_0.field_3.Type == '\0') {
                      if ((player_t *)puVar11[0x40] != (player_t *)0x0) {
                        uVar2 = param[4].field_0.i;
                        iVar3 = param[5].field_0.i;
                        pDVar7 = player_t::FindPSprite((player_t *)puVar11[0x40],param[3].field_0.i)
                        ;
                        if (pDVar7 != (DPSprite *)0x0) {
                          if (iVar3 == 0) {
                            pDVar7->Flags = pDVar7->Flags & ~uVar2;
                          }
                          else {
                            pDVar7->Flags = pDVar7->Flags | uVar2;
                          }
                        }
                      }
                      return 0;
                    }
                    pcVar10 = "param[paramnum].Type == REGT_INT";
                  }
                  __assert_fail(pcVar10,
                                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                                ,0x408,
                                "int AF_A_OverlayFlags(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                               );
                }
                pcVar10 = "param[paramnum].Type == REGT_INT";
              }
              __assert_fail(pcVar10,
                            "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                            ,0x407,
                            "int AF_A_OverlayFlags(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                           );
            }
            pcVar10 = "param[paramnum].Type == REGT_INT";
            goto LAB_0055a08a;
          }
        }
      }
      pcVar10 = "(paramnum) < numparam";
LAB_0055a08a:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                    ,0x406,"int AF_A_OverlayFlags(VMFrameStack *, VMValue *, int, VMReturn *, int)")
      ;
    }
    if (puVar11 == (undefined8 *)0x0) goto LAB_00559f3e;
  }
LAB_0055a071:
  pcVar10 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0055a0f9:
  __assert_fail(pcVar10,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                ,0x405,"int AF_A_OverlayFlags(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_OverlayFlags)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_INT(layer);
	PARAM_INT(flags);
	PARAM_BOOL(set);

	if (self->player == nullptr)
		return 0;

	DPSprite *pspr = self->player->FindPSprite(layer);

	if (pspr == nullptr)
		return 0;

	if (set)
		pspr->Flags |= flags;
	else
		pspr->Flags &= ~flags;

	return 0;
}